

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.h
# Opt level: O1

void __thiscall BlockFilter::Serialize<VectorWriter>(BlockFilter *this,VectorWriter *s)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  BlockFilterType local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = this->m_filter_type;
  VectorWriter::write(s,(int)&local_19,(void *)0x1,in_RCX);
  VectorWriter::write(s,(int)this + 1,(void *)0x20,in_RCX);
  VectorWriter::operator<<(s,&(this->m_filter).m_encoded);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const {
        s << static_cast<uint8_t>(m_filter_type)
          << m_block_hash
          << m_filter.GetEncoded();
    }